

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-pprint.hh
# Opt level: O3

ostream * std::operator<<(ostream *os,
                         vector<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_>
                         *v)

{
  ulong uVar1;
  ulong uVar2;
  pointer pnVar3;
  long lVar4;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"[",1);
  pnVar3 = (v->
           super__Vector_base<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((v->super__Vector_base<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_>)
      ._M_impl.super__Vector_impl_data._M_finish != pnVar3) {
    lVar4 = 0;
    uVar2 = 0;
    do {
      operator<<(os,(normal3h *)((long)&(pnVar3->x).value + lVar4));
      pnVar3 = (v->
               super__Vector_base<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_>
               )._M_impl.super__Vector_impl_data._M_start;
      uVar1 = ((long)(v->
                     super__Vector_base<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_>
                     )._M_impl.super__Vector_impl_data._M_finish - (long)pnVar3 >> 1) *
              -0x5555555555555555;
      if (uVar2 != uVar1 - 1) {
        std::__ostream_insert<char,std::char_traits<char>>(os,", ",2);
        pnVar3 = (v->
                 super__Vector_base<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        uVar1 = ((long)(v->
                       super__Vector_base<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_>
                       )._M_impl.super__Vector_impl_data._M_finish - (long)pnVar3 >> 1) *
                -0x5555555555555555;
      }
      uVar2 = uVar2 + 1;
      lVar4 = lVar4 + 6;
    } while (uVar2 < uVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"]",1);
  return os;
}

Assistant:

std::ostream &operator<<(std::ostream &os, const std::vector<T> &v) {
  os << "[";
  for (size_t i = 0; i < v.size(); i++) {
    os << v[i];
    if (i != (v.size() - 1)) {
      os << ", ";
    }
  }
  os << "]";
  return os;
}